

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly_short_sample_plus(poly *out,uint8_t *in)

{
  uint local_28;
  uint i_1;
  uint16_t scale;
  uint i;
  uint16_t sum;
  uint8_t *in_local;
  poly *out_local;
  
  poly_short_sample(out,in);
  scale = 0;
  for (i_1 = 0; i_1 < 699; i_1 = i_1 + 1) {
    scale = scale + (out->field_0).v[i_1] * (out->field_0).v[i_1 + 1];
  }
  for (local_28 = 0; local_28 < 0x2bd; local_28 = local_28 + 2) {
    (out->field_0).v[local_28] =
         (out->field_0).v[local_28] * ((short)scale >> 0xf | ((short)scale >> 0xf ^ 0xffffU) & 1);
  }
  poly_assert_normalized(out);
  return;
}

Assistant:

static void poly_short_sample_plus(struct poly *out,
                                   const uint8_t in[HRSS_SAMPLE_BYTES]) {
  poly_short_sample(out, in);

  // sum (and the product in the for loop) will overflow. But that's fine
  // because |sum| is bound by +/- (N-2), and N < 2^15 so it works out.
  uint16_t sum = 0;
  for (unsigned i = 0; i < N - 2; i++) {
    sum += (unsigned)out->v[i] * out->v[i + 1];
  }

  // If the sum is negative, flip the sign of even-positioned coefficients. (See
  // page 8 of [HRSS].)
  sum = ((int16_t)sum) >> 15;
  const uint16_t scale = sum | (~sum & 1);
  for (unsigned i = 0; i < N; i += 2) {
    out->v[i] = (unsigned)out->v[i] * scale;
  }
  poly_assert_normalized(out);
}